

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O2

void Qentem::Digit::powerOfNegativeTen<unsigned_long_long>
               (unsigned_long_long *number,SizeT32 exponent)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  BigInt<unsigned_long_long,_256U> b_int;
  
  b_int.storage_[0] = *number;
  b_int.storage_[1] = 0;
  b_int.storage_[2] = 0;
  b_int.storage_[3] = 0;
  b_int.index_ = 0;
  BigInt<unsigned_long_long,_256U>::ShiftLeft(&b_int,0x40);
  iVar5 = -0x40 - exponent;
  for (lVar4 = 0; 0x1a < exponent + (int)lVar4; lVar4 = lVar4 + -0x1b) {
    BigInt<unsigned_long_long,_256U>::Multiply(&b_int,0x9e74d1b791e07e48);
    BigInt<unsigned_long_long,_256U>::ShiftRight(&b_int,0x40);
    iVar5 = iVar5 + -0x3e;
  }
  if (exponent + (int)lVar4 == 0) {
    uVar1 = -iVar5;
  }
  else {
    BigInt<unsigned_long_long,_256U>::Multiply
              (&b_int,*(unsigned_long_long *)
                       (DigitUtils::DigitConst<8u>::GetPowerOfOneOverFive(unsigned_int)::
                        PowerOfOneOverFive + lVar4 * 8 + (ulong)exponent * 8));
    BigInt<unsigned_long_long,_256U>::ShiftRight(&b_int,0x40);
    uVar1 = *(int *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFiveShift(unsigned_int)::
                     PowerOfOneOverFiveShift + lVar4 * 4 + (ulong)exponent * 4) - iVar5;
  }
  uVar6 = (b_int.index_ << 6 | (uint)LZCOUNT(b_int.storage_[b_int.index_])) ^ 0x3f;
  BigInt<unsigned_long_long,_256U>::ShiftRight(&b_int,uVar6 - 0x35);
  uVar3 = uVar1 - uVar6;
  if (uVar1 < uVar6 || uVar3 == 0) {
    uVar2 = ((uint)b_int.storage_[0] & 1) + b_int.storage_[0];
    uVar7 = (ulong)(((uVar6 - uVar1) - (uint)(uVar2 >> 0x36 == 0)) + 0x400);
  }
  else if (uVar3 < 0x3ff) {
    uVar2 = ((uint)b_int.storage_[0] & 1) + b_int.storage_[0];
    uVar7 = (ulong)(0x3ff - ((uVar3 - 1) + (uint)(uVar2 >> 0x36 == 0)));
  }
  else {
    uVar2 = (b_int.storage_[0] >> ((ulong)(uVar3 - 0x3fe) & 0x3f)) +
            (ulong)((b_int.storage_[0] >> ((ulong)(uVar3 - 0x3fe) & 0x3f) & 1) != 0);
    uVar7 = (ulong)(uVar2 >> 0x35 != 0);
  }
  *number = uVar7 << 0x34 | uVar2 >> 1 & 0xfffffffffffff;
  return;
}

Assistant:

static void powerOfNegativeTen(Number_T &number, SizeT32 exponent) noexcept {
        using UNumber_T  = SizeT64;
        using DigitConst = DigitUtils::DigitConst<sizeof(UNumber_T)>;
        //////////////////////////////////////////////////////////////
        BigInt<UNumber_T, 256U> b_int{number};
        //////////////////////////////////////////////////////////////
        SizeT32 shifted{exponent};
        //////////////////////////////////////////////////////////////
        shifted += 64U;
        b_int <<= 64U;
        //////////////////////////////////////////////////////////////
        constexpr bool is_size_8 = (sizeof(UNumber_T) == 8U);
        if QENTEM_CONST_EXPRESSION (is_size_8) {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                // 2**126 = 85070591730234615865843651857942052864
                // 5**27 = 7450580596923828125 (MaxPowerOfFive)
                // 2**126 / 5**27 = 11417981541647679048.4
                // 126-64=62; See 2**126 and 64 shift

                b_int *= DigitConst::GetPowerOfOneOverFive(DigitConst::MaxPowerOfFive);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(DigitConst::MaxPowerOfFive);
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int *= DigitConst::GetPowerOfOneOverFive(exponent);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(exponent);
            }
        } else {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);
                shifted += DigitConst::MaxShift;
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(exponent);
                shifted += DigitConst::MaxShift;
            }
        }
        //////////////////////////////////////////////////////////////
        SizeT32       exp = DigitUtils::RealNumberInfo<double, 8U>::Bias; // double only
        const SizeT32 bit = b_int.FindLastBit();

        // if (bit <= 52U) {
        //     number = SizeT64(b_int);
        //     number <<= (53U - bit);
        // } else {
        b_int >>= (bit - SizeT32{53});
        number = SizeT64(b_int);
        // }
        //////////////////////////////////////////////////////////////
        if (shifted <= bit) {
            shifted = (bit - shifted);
            exp += shifted;

            number += (number & Number_T{1});
            number >>= 1U;
            exp += (number > Number_T{0x1FFFFFFFFFFFFF});
        } else {
            shifted -= bit;

            if (exp > shifted) {
                exp -= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp += (number > Number_T{0x1FFFFFFFFFFFFF});
            } else {
                shifted -= exp;
                ++shifted;
                number >>= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp = (number > Number_T{0xFFFFFFFFFFFFF});
            }
        }

        number &= 0xFFFFFFFFFFFFFULL;
        number |= (SizeT64(exp) << 52U);
    }